

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

int Acb_NtkFindDivs_rec(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  if ((iObj < 0) || ((p->vObjTrav).nSize <= iObj)) {
LAB_0036eadf:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar3 = (p->vObjTrav).pArray;
  iVar1 = piVar3[(uint)iObj];
  iVar2 = p->nObjTravs;
  iVar6 = 1;
  if (iVar1 != iVar2 + -1) {
    piVar3[(uint)iObj] = iVar2;
    iVar6 = 0;
    if (iVar1 != iVar2) {
      if (iObj == 0) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      iVar6 = 0;
      if ((p->vObjType).pArray[(uint)iObj] != '\x03') {
        if (iObj < (p->vObjFans).nSize) {
          iVar1 = (p->vObjFans).pArray[(uint)iObj];
          lVar9 = (long)iVar1;
          if ((lVar9 < 0) || ((p->vFanSto).nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar3 = (p->vFanSto).pArray;
          if (0 < piVar3[lVar9]) {
            uVar8 = 1;
            lVar7 = 0;
            do {
              lVar4 = lVar7 + 1;
              lVar7 = lVar7 + 1;
              uVar5 = Acb_NtkFindDivs_rec(p,piVar3[lVar9 + lVar4]);
              uVar8 = uVar8 & uVar5;
            } while (lVar7 < piVar3[lVar9]);
            if (uVar8 == 0) {
              return 0;
            }
          }
          if (iObj < (p->vObjTrav).nSize) {
            (p->vObjTrav).pArray[(uint)iObj] = p->nObjTravs + -1;
            return 1;
          }
        }
        goto LAB_0036eadf;
      }
    }
  }
  return iVar6;
}

Assistant:

int Acb_NtkFindDivs_rec( Acb_Ntk_t * p, int iObj )
{
    int * pFanin, iFanin, i, Res = 1;
    if ( Acb_ObjIsTravIdPrev(p, iObj) )
        return 1;
    if ( Acb_ObjSetTravIdCur(p, iObj) )  
        return 0;
    if ( Acb_ObjIsCi(p, iObj) )
        return 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
        Res &= Acb_NtkFindDivs_rec( p, iFanin );
    if ( Res ) Acb_ObjSetTravIdPrev( p, iObj );
    return Res;
}